

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O1

void __thiscall
duckdb::JoinHashTable::ProbeAndSpill
          (JoinHashTable *this,ScanStructure *scan_structure,DataChunk *probe_keys,
          TupleDataChunkState *key_state,ProbeState *probe_state,DataChunk *probe_chunk,
          ProbeSpill *probe_spill,ProbeSpillLocalAppendState *spill_state,DataChunk *spill_chunk)

{
  idx_t iVar1;
  SelectionVector *pSVar2;
  idx_t count;
  reference this_00;
  ProbeSpill *this_01;
  SelectionVector true_sel;
  SelectionVector *current_sel;
  SelectionVector false_sel;
  LogicalType local_b0;
  Vector hashes;
  
  LogicalType::LogicalType(&local_b0,UBIGINT);
  Vector::Vector(&hashes,&local_b0,0x800);
  LogicalType::~LogicalType(&local_b0);
  pSVar2 = FlatVector::IncrementalSelectionVector();
  Hash(this,probe_keys,pSVar2,probe_keys->count,&hashes);
  SelectionVector::SelectionVector(&true_sel,0x800);
  SelectionVector::SelectionVector(&false_sel,0x800);
  pSVar2 = FlatVector::IncrementalSelectionVector();
  count = RadixPartitioning::Select
                    (&hashes,pSVar2,probe_keys->count,this->radix_bits,&this->current_partitions,
                     &true_sel,&false_sel);
  iVar1 = probe_keys->count;
  DataChunk::Reset(spill_chunk);
  DataChunk::Reference(spill_chunk,probe_chunk);
  this_00 = vector<duckdb::Vector,_true>::back(&spill_chunk->data);
  Vector::Reference(this_00,&hashes);
  this_01 = (ProbeSpill *)spill_chunk;
  DataChunk::Slice(spill_chunk,&false_sel,iVar1 - count);
  ProbeSpill::Append(this_01,spill_chunk,spill_state);
  Vector::Slice(&hashes,&true_sel,count);
  DataChunk::Slice(probe_keys,&true_sel,count);
  DataChunk::Slice(probe_chunk,&true_sel,count);
  InitializeScanStructure(this,scan_structure,probe_keys,key_state,&current_sel);
  if (scan_structure->count != 0) {
    GetRowPointers(this,probe_keys,key_state,probe_state,&hashes,current_sel,&scan_structure->count,
                   &scan_structure->pointers,&scan_structure->sel_vector);
  }
  if (false_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (false_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (true_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (true_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (hashes.auxiliary.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (hashes.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (hashes.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (hashes.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (hashes.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (hashes.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&hashes.type);
  return;
}

Assistant:

void JoinHashTable::ProbeAndSpill(ScanStructure &scan_structure, DataChunk &probe_keys, TupleDataChunkState &key_state,
                                  ProbeState &probe_state, DataChunk &probe_chunk, ProbeSpill &probe_spill,
                                  ProbeSpillLocalAppendState &spill_state, DataChunk &spill_chunk) {
	// hash all the keys
	Vector hashes(LogicalType::HASH);
	Hash(probe_keys, *FlatVector::IncrementalSelectionVector(), probe_keys.size(), hashes);

	// find out which keys we can match with the current pinned partitions
	SelectionVector true_sel(STANDARD_VECTOR_SIZE);
	SelectionVector false_sel(STANDARD_VECTOR_SIZE);
	const auto true_count =
	    RadixPartitioning::Select(hashes, FlatVector::IncrementalSelectionVector(), probe_keys.size(), radix_bits,
	                              current_partitions, &true_sel, &false_sel);
	const auto false_count = probe_keys.size() - true_count;

	// can't probe these values right now, append to spill
	spill_chunk.Reset();
	spill_chunk.Reference(probe_chunk);
	spill_chunk.data.back().Reference(hashes);
	spill_chunk.Slice(false_sel, false_count);
	probe_spill.Append(spill_chunk, spill_state);

	// slice the stuff we CAN probe right now
	hashes.Slice(true_sel, true_count);
	probe_keys.Slice(true_sel, true_count);
	probe_chunk.Slice(true_sel, true_count);

	const SelectionVector *current_sel;
	InitializeScanStructure(scan_structure, probe_keys, key_state, current_sel);
	if (scan_structure.count == 0) {
		return;
	}

	// now initialize the pointers of the scan structure based on the hashes
	GetRowPointers(probe_keys, key_state, probe_state, hashes, *current_sel, scan_structure.count,
	               scan_structure.pointers, scan_structure.sel_vector);
}